

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

bool woff2::ReadTrueTypeCollection
               (Buffer *file,uint8_t *data,size_t len,FontCollection *font_collection)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  size_t i;
  ulong uVar4;
  pointer puVar5;
  pointer font;
  uint32_t num_fonts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  all_tables;
  uint local_8c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  size_t local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table_*>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  local_60;
  
  local_68 = len;
  bVar2 = Buffer::ReadU32(file,&font_collection->header_version);
  if ((!bVar2) || (bVar2 = Buffer::ReadU32(file,&local_8c), !bVar2)) {
    return false;
  }
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  for (uVar4 = 0; uVar4 < local_8c; uVar4 = uVar4 + 1) {
    bVar2 = Buffer::ReadU32(file,(uint32_t *)&local_60);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0010a507;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
               (value_type_conflict1 *)&local_60);
  }
  std::vector<woff2::Font,_std::allocator<woff2::Font>_>::resize
            (&font_collection->fonts,
             (long)local_88._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88._M_impl.super__Vector_impl_data._M_start >> 2);
  puVar1 = local_88._M_impl.super__Vector_impl_data._M_finish;
  font = (font_collection->fonts).super__Vector_base<woff2::Font,_std::allocator<woff2::Font>_>.
         _M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar5 = local_88._M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar2 = puVar5 == puVar1;
    if (bVar2) break;
    file->offset_ = (ulong)*puVar5;
    bVar3 = ReadCollectionFont(file,data,local_68,font,
                               (map<unsigned_int,_woff2::Font::Table_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
                                *)&local_60);
    font = font + 1;
    puVar5 = puVar5 + 1;
  } while (bVar3);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_woff2::Font::Table_*>,_std::_Select1st<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table_*>_>_>
  ::~_Rb_tree(&local_60);
LAB_0010a507:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  return bVar2;
}

Assistant:

bool ReadTrueTypeCollection(Buffer* file, const uint8_t* data, size_t len,
                            FontCollection* font_collection) {
    uint32_t num_fonts;

    if (!file->ReadU32(&font_collection->header_version) ||
        !file->ReadU32(&num_fonts)) {
      return FONT_COMPRESSION_FAILURE();
    }

    std::vector<uint32_t> offsets;
    for (size_t i = 0; i < num_fonts; i++) {
      uint32_t offset;
      if (!file->ReadU32(&offset)) {
        return FONT_COMPRESSION_FAILURE();
      }
      offsets.push_back(offset);
    }

    font_collection->fonts.resize(offsets.size());
    std::vector<Font>::iterator font_it = font_collection->fonts.begin();

    std::map<uint32_t, Font::Table*> all_tables;
    for (const auto offset : offsets) {
      file->set_offset(offset);
      Font& font = *font_it++;
      if (!ReadCollectionFont(file, data, len, &font, &all_tables)) {
        return FONT_COMPRESSION_FAILURE();
      }
    }

    return true;
}